

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# signal-cast-registerer.cpp
# Opt level: O0

void __thiscall standard_double_registerer::test_method(standard_double_registerer *this)

{
  undefined8 uVar1;
  bool bVar2;
  type ppVar3;
  lazy_ostream *plVar4;
  pair<const_char_*,_const_char_*> pVar5;
  byte local_be2;
  exception *ex;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[49],_const_char_(&)[49]> local_ad0;
  assertion_result local_ab0;
  basic_cstring<const_char> local_a98;
  basic_cstring<const_char> local_a88;
  basic_cstring<const_char> local_a78;
  basic_cstring<const_char> local_a68;
  allocator<char> local_a51;
  string local_a50 [32];
  istringstream local_a30 [8];
  istringstream value;
  string local_8b0 [32];
  basic_cstring<const_char> local_890;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> local_880;
  basic_cstring<const_char> local_858;
  basic_cstring<const_char> local_848;
  basic_cstring<const_char> local_838;
  undefined1 local_828 [8];
  output_test_stream output_1;
  string local_6a8 [32];
  basic_cstring<const_char> local_688;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> local_678;
  basic_cstring<const_char> local_650;
  basic_cstring<const_char> local_640;
  basic_cstring<const_char> local_630;
  undefined1 local_620 [8];
  output_test_stream output;
  istringstream local_4a0 [8];
  istringstream value_1;
  test_t *test;
  __normal_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  _Stack_310;
  bool _foreach_continue52;
  auto_any_base *local_308;
  auto_any_t _foreach_end52;
  auto_any_base *local_2f8;
  auto_any_t _foreach_cur52;
  auto_any_t local_2e8;
  auto_any_t _foreach_col52;
  char *local_2d8;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_2d0;
  pair<const_char_*,_const_char_*> local_290;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_280;
  pair<const_char_*,_const_char_*> local_240;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_230;
  pair<const_char_*,_const_char_*> local_1f0;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_1e0;
  pair<const_char_*,_const_char_*> local_1a0;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_190;
  pair<const_char_*,_const_char_*> local_150;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_140;
  undefined1 local_100 [8];
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  values;
  allocator<char> local_d1;
  string local_d0;
  undefined1 local_b0 [8];
  Signal<double,_int> mySignal;
  standard_double_registerer *this_local;
  
  mySignal.providerMutex = (Mutex *)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_d0,"out",&local_d1);
  dynamicgraph::Signal<double,_int>::Signal((Signal<double,_int> *)local_b0,&local_d0);
  std::__cxx11::string::~string((string *)&local_d0);
  std::allocator<char>::~allocator(&local_d1);
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            *)local_100);
  local_150 = std::make_pair<char_const(&)[5],char_const(&)[3]>
                        ((char (*) [5])"42.0",(char (*) [3])"42");
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::pair<const_char_*,_const_char_*,_true>(&local_140,&local_150);
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::push_back((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *)local_100,&local_140);
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~pair(&local_140);
  local_1a0 = std::make_pair<char_const(&)[5],char_const(&)[5]>
                        ((char (*) [5])"42.5",(char (*) [5])"42.5");
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::pair<const_char_*,_const_char_*,_true>(&local_190,&local_1a0);
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::push_back((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *)local_100,&local_190);
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~pair(&local_190);
  local_1f0 = std::make_pair<char_const(&)[5],char_const(&)[4]>
                        ((char (*) [5])"-12.",(char (*) [4])"-12");
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::pair<const_char_*,_const_char_*,_true>(&local_1e0,&local_1f0);
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::push_back((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *)local_100,&local_1e0);
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~pair(&local_1e0);
  local_240 = std::make_pair<char_const(&)[4],char_const(&)[4]>
                        ((char (*) [4])0x1560eb,(char (*) [4])0x1560eb);
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::pair<const_char_*,_const_char_*,_true>(&local_230,&local_240);
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::push_back((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *)local_100,&local_230);
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~pair(&local_230);
  local_290 = std::make_pair<char_const(&)[5],char_const(&)[5]>
                        ((char (*) [5])"-inf",(char (*) [5])"-inf");
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::pair<const_char_*,_const_char_*,_true>(&local_280,&local_290);
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::push_back((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *)local_100,&local_280);
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~pair(&local_280);
  pVar5 = std::make_pair<char_const(&)[4],char_const(&)[4]>((char (*) [4])"nan",(char (*) [4])"nan")
  ;
  local_2d8 = pVar5.second;
  _foreach_col52 = (auto_any_t)pVar5.first;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::pair<const_char_*,_const_char_*,_true>
            (&local_2d0,(pair<const_char_*,_const_char_*> *)&_foreach_col52);
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::push_back((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *)local_100,&local_2d0);
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~pair(&local_2d0);
  _foreach_cur52 =
       (auto_any_t)
       boost::foreach_detail_::
       contain<std::vector<std::pair<std::__cxx11::string,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string,std::__cxx11::string>>>>
                 ((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   *)local_100,(false_ *)0x0);
  local_2e8 = (auto_any_t)&_foreach_cur52;
  bVar2 = boost::foreach_detail_::auto_any_base::operator_cast_to_bool(local_2e8);
  if (!bVar2) {
    _foreach_end52 =
         (auto_any_t)
         boost::foreach_detail_::
         begin<std::vector<std::pair<std::__cxx11::string,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string,std::__cxx11::string>>>,mpl_::bool_<false>>
                   (local_2e8,
                    (type2type<std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_mpl_::bool_<false>_>
                     *)0x0,(false_ *)0x0);
    local_2f8 = (auto_any_base *)&_foreach_end52;
    bVar2 = boost::foreach_detail_::auto_any_base::operator_cast_to_bool(local_2f8);
    if (!bVar2) {
      _Stack_310._M_current =
           (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            *)boost::foreach_detail_::
              end<std::vector<std::pair<std::__cxx11::string,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string,std::__cxx11::string>>>,mpl_::bool_<false>>
                        (local_2e8,
                         (type2type<std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_mpl_::bool_<false>_>
                          *)0x0,(false_ *)0x0);
      local_308 = (auto_any_base *)&stack0xfffffffffffffcf0;
      bVar2 = boost::foreach_detail_::auto_any_base::operator_cast_to_bool(local_308);
      if (!bVar2) {
        test._7_1_ = 1;
        while( true ) {
          local_be2 = 0;
          if ((test._7_1_ & 1) != 0) {
            bVar2 = boost::foreach_detail_::
                    done<std::vector<std::pair<std::__cxx11::string,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string,std::__cxx11::string>>>,mpl_::bool_<false>>
                              (local_2f8,local_308,
                               (type2type<std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_mpl_::bool_<false>_>
                                *)0x0);
            local_be2 = bVar2 ^ 0xff;
          }
          if ((local_be2 & 1) == 0) break;
          bVar2 = boost::foreach_detail_::set_false((bool *)((long)&test + 7));
          if (!bVar2) {
            ppVar3 = boost::foreach_detail_::
                     deref<std::vector<std::pair<std::__cxx11::string,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string,std::__cxx11::string>>>,mpl_::bool_<false>>
                               (local_2f8,
                                (type2type<std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_mpl_::bool_<false>_>
                                 *)0x0);
            while (((test._7_1_ ^ 0xff) & 1) != 0) {
              std::__cxx11::istringstream::istringstream(local_4a0,(string *)ppVar3,_S_in);
              dynamicgraph::Signal<double,_int>::set
                        ((Signal<double,_int> *)local_b0,(istringstream *)local_4a0);
              boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_630);
              boost::test_tools::output_test_stream::output_test_stream
                        ((output_test_stream *)local_620,&local_630,1);
              dynamicgraph::Signal<double,_int>::get
                        ((Signal<double,_int> *)local_b0,(ostream *)local_620);
              do {
                uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
                boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                          (&local_640,
                           "/workspace/llm4binary/github/license_c_cmakelists/stack-of-tasks[P]dynamic-graph/tests/signal-cast-registerer.cpp"
                           ,0x71);
                boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_650);
                boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_640,0x3d,&local_650);
                plVar4 = boost::unit_test::lazy_ostream::instance();
                boost::unit_test::operator<<(&local_678,plVar4,(char (*) [1])0x1573bb);
                boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                          (&local_688,
                           "/workspace/llm4binary/github/license_c_cmakelists/stack-of-tasks[P]dynamic-graph/tests/signal-cast-registerer.cpp"
                           ,0x71);
                std::__cxx11::ostringstream::str();
                boost::test_tools::tt_detail::
                check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,std::__cxx11::string>
                          (&local_678,&local_688,0x3d,1,2,local_6a8,"output.str()",&ppVar3->second,
                           "test.second");
                std::__cxx11::string::~string(local_6a8);
                boost::unit_test::
                lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>::
                ~lazy_ostream_impl(&local_678);
                bVar2 = boost::test_tools::tt_detail::dummy_cond();
              } while (bVar2);
              boost::test_tools::output_test_stream::~output_test_stream
                        ((output_test_stream *)local_620);
              boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_838);
              boost::test_tools::output_test_stream::output_test_stream
                        ((output_test_stream *)local_828,&local_838,1);
              dynamicgraph::Signal<double,_int>::trace
                        ((Signal<double,_int> *)local_b0,(ostream *)local_828);
              do {
                uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
                boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                          (&local_848,
                           "/workspace/llm4binary/github/license_c_cmakelists/stack-of-tasks[P]dynamic-graph/tests/signal-cast-registerer.cpp"
                           ,0x71);
                boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_858);
                boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_848,0x44,&local_858);
                plVar4 = boost::unit_test::lazy_ostream::instance();
                boost::unit_test::operator<<(&local_880,plVar4,(char (*) [1])0x1573bb);
                boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                          (&local_890,
                           "/workspace/llm4binary/github/license_c_cmakelists/stack-of-tasks[P]dynamic-graph/tests/signal-cast-registerer.cpp"
                           ,0x71);
                std::__cxx11::ostringstream::str();
                boost::test_tools::tt_detail::
                check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,std::__cxx11::string>
                          (&local_880,&local_890,0x44,1,2,local_8b0,"output.str()",&ppVar3->second,
                           "test.second");
                std::__cxx11::string::~string(local_8b0);
                boost::unit_test::
                lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>::
                ~lazy_ostream_impl(&local_880);
                bVar2 = boost::test_tools::tt_detail::dummy_cond();
              } while (bVar2);
              boost::test_tools::output_test_stream::~output_test_stream
                        ((output_test_stream *)local_828);
              std::__cxx11::istringstream::~istringstream(local_4a0);
              test._7_1_ = 1;
            }
          }
          if ((test._7_1_ & 1) != 0) {
            boost::foreach_detail_::
            next<std::vector<std::pair<std::__cxx11::string,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string,std::__cxx11::string>>>,mpl_::bool_<false>>
                      (local_2f8,
                       (type2type<std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_mpl_::bool_<false>_>
                        *)0x0);
          }
        }
      }
    }
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_a50,"This is not a valid double.",&local_a51);
  std::__cxx11::istringstream::istringstream(local_a30,local_a50,_S_in);
  std::__cxx11::string::~string(local_a50);
  std::allocator<char>::~allocator(&local_a51);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_a68,
               "/workspace/llm4binary/github/license_c_cmakelists/stack-of-tasks[P]dynamic-graph/tests/signal-cast-registerer.cpp"
               ,0x71);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_a78);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_a68,0x4b,&local_a78);
    dynamicgraph::Signal<double,_int>::set
              ((Signal<double,_int> *)local_b0,(istringstream *)local_a30);
    do {
      uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                (&local_a88,
                 "/workspace/llm4binary/github/license_c_cmakelists/stack-of-tasks[P]dynamic-graph/tests/signal-cast-registerer.cpp"
                 ,0x71);
      boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_a98);
      boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_a88,0x4b,&local_a98);
      boost::test_tools::assertion_result::assertion_result(&local_ab0,false);
      plVar4 = boost::unit_test::lazy_ostream::instance();
      boost::unit_test::operator<<
                (&local_ad0,plVar4,(char (*) [49])"exception std::exception expected but not raised"
                );
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)&ex,
                 "/workspace/llm4binary/github/license_c_cmakelists/stack-of-tasks[P]dynamic-graph/tests/signal-cast-registerer.cpp"
                 ,0x71);
      boost::test_tools::tt_detail::report_assertion(&local_ab0,&local_ad0,&ex,0x4b,1,1,0);
      boost::unit_test::
      lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[49],_const_char_(&)[49]>::
      ~lazy_ostream_impl(&local_ad0);
      boost::test_tools::assertion_result::~assertion_result(&local_ab0);
      bVar2 = boost::test_tools::tt_detail::dummy_cond();
    } while (bVar2);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  std::__cxx11::istringstream::~istringstream(local_a30);
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             *)local_100);
  dynamicgraph::Signal<double,_int>::~Signal((Signal<double,_int> *)local_b0);
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(standard_double_registerer) {
  dynamicgraph::Signal<double, int> mySignal("out");

  typedef std::pair<std::string, std::string> test_t;
  std::vector<test_t> values;

  values.push_back(std::make_pair("42.0", "42"));
  values.push_back(std::make_pair("42.5", "42.5"));
  values.push_back(std::make_pair("-12.", "-12"));

  // Double special values.
  // FIXME: these tests are failing :(
  values.push_back(std::make_pair("inf", "inf"));
  values.push_back(std::make_pair("-inf", "-inf"));
  values.push_back(std::make_pair("nan", "nan"));

  BOOST_FOREACH (const test_t &test, values) {
    // Set
    std::istringstream value(test.first);
    mySignal.set(value);

    // Get
    {
      output_test_stream output;
      mySignal.get(output);
      BOOST_CHECK_EQUAL(output.str(), test.second);
    }

    // Trace
    {
      output_test_stream output;
      mySignal.trace(output);
      BOOST_CHECK_EQUAL(output.str(), test.second);
    }
  }

  // Check invalid values.
  // FIXME: this test is failing for now.
  std::istringstream value("This is not a valid double.");
  BOOST_CHECK_THROW(mySignal.set(value), std::exception);
}